

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

void __thiscall
kj::Vector<const_kj::ReadableDirectory_*>::setCapacity
          (Vector<const_kj::ReadableDirectory_*> *this,size_t newSize)

{
  ReadableDirectory **ppRVar1;
  ArrayBuilder<const_kj::ReadableDirectory_*> newBuilder;
  ArrayBuilder<const_kj::ReadableDirectory_*> local_30;
  
  ppRVar1 = (this->builder).ptr;
  if (newSize < (ulong)((long)(this->builder).pos - (long)ppRVar1 >> 3)) {
    (this->builder).pos = ppRVar1 + newSize;
  }
  local_30.ptr = kj::_::HeapArrayDisposer::allocateUninitialized<kj::ReadableDirectory_const*>
                           (newSize);
  local_30.endPtr = local_30.ptr + newSize;
  local_30.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  local_30.pos = local_30.ptr;
  ArrayBuilder<kj::ReadableDirectory_const*>::addAll<kj::ArrayBuilder<kj::ReadableDirectory_const*>>
            ((ArrayBuilder<kj::ReadableDirectory_const*> *)&local_30,&this->builder);
  ArrayBuilder<const_kj::ReadableDirectory_*>::operator=(&this->builder,&local_30);
  ArrayBuilder<const_kj::ReadableDirectory_*>::dispose(&local_30);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }